

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# wlcBlast.c
# Opt level: O3

void Wlc_BlastSquare(Gia_Man_t *pNew,int *pNum,int nNum,Vec_Int_t *vTmp,Vec_Int_t *vRes)

{
  void *pvVar1;
  int iVar2;
  Vec_Wec_t *vProds;
  Vec_Wec_t *vLevels;
  Vec_Int_t *pVVar3;
  ulong uVar4;
  ulong uVar5;
  long lVar6;
  long lVar7;
  uint uVar8;
  int iVar9;
  uint uVar10;
  size_t __size;
  int iVar11;
  ulong uVar12;
  ulong uVar13;
  int iVar14;
  int iVar15;
  ulong uVar16;
  int iVar17;
  uint uVar18;
  Vec_Int_t *local_90;
  
  uVar10 = nNum * 2;
  uVar4 = (ulong)uVar10;
  vProds = (Vec_Wec_t *)malloc(0x10);
  uVar16 = 8;
  if (6 < nNum * 2 - 1U) {
    uVar16 = (ulong)uVar10;
  }
  iVar14 = (int)uVar16;
  vProds->nCap = iVar14;
  if (iVar14 == 0) {
    local_90 = (Vec_Int_t *)0x0;
  }
  else {
    local_90 = (Vec_Int_t *)calloc((long)iVar14,0x10);
  }
  vProds->pArray = local_90;
  vProds->nSize = uVar10;
  vLevels = (Vec_Wec_t *)malloc(0x10);
  vLevels->nCap = iVar14;
  if (iVar14 == 0) {
    pVVar3 = (Vec_Int_t *)0x0;
  }
  else {
    pVVar3 = (Vec_Int_t *)calloc((long)iVar14,0x10);
  }
  vLevels->pArray = pVVar3;
  vLevels->nSize = uVar10;
  if (0 < nNum) {
    lVar6 = 0x10;
    uVar5 = 0;
    uVar12 = (ulong)uVar10;
    do {
      iVar14 = (int)uVar5;
      iVar9 = iVar14 * 2;
      uVar10 = iVar9 + 1;
      uVar13 = 0;
      lVar7 = lVar6;
      do {
        iVar15 = (int)uVar16;
        if (uVar5 == uVar13) {
          iVar2 = pNum[uVar5];
          if ((int)uVar4 <= iVar9) {
            uVar8 = (int)uVar4 * 2;
            if ((int)uVar8 <= (int)uVar10) {
              uVar8 = uVar10;
            }
            if (uVar8 - iVar15 != 0 && iVar15 <= (int)uVar8) {
              __size = (ulong)uVar8 << 4;
              if (local_90 == (Vec_Int_t *)0x0) {
                local_90 = (Vec_Int_t *)malloc(__size);
              }
              else {
                local_90 = (Vec_Int_t *)realloc(local_90,__size);
              }
              vProds->pArray = local_90;
              memset(local_90 + iVar15,0,(long)(int)(uVar8 - iVar15) << 4);
              vProds->nCap = uVar8;
              uVar16 = (ulong)uVar8;
            }
            vProds->nSize = uVar10;
            uVar4 = (ulong)uVar10;
          }
          if ((int)uVar4 <= iVar9) {
LAB_008b1cef:
            __assert_fail("i >= 0 && i < p->nSize",
                          "/workspace/llm4binary/github/license_all_cmakelists_25/Runnlion[P]LSV-PA/src/misc/vec/vecWec.h"
                          ,0x9c,"Vec_Int_t *Vec_WecEntry(Vec_Wec_t *, int)");
          }
          Vec_IntPush(local_90 + uVar5 * 2,iVar2);
          if (vLevels->nSize <= iVar9) {
            uVar8 = vLevels->nSize * 2;
            if ((int)uVar8 <= (int)uVar10) {
              uVar8 = uVar10;
            }
            iVar15 = vLevels->nCap;
            if (iVar15 < (int)uVar8) {
              if (vLevels->pArray == (Vec_Int_t *)0x0) {
                pVVar3 = (Vec_Int_t *)malloc((ulong)uVar8 << 4);
              }
              else {
                pVVar3 = (Vec_Int_t *)realloc(vLevels->pArray,(ulong)uVar8 << 4);
              }
              vLevels->pArray = pVVar3;
              memset(pVVar3 + iVar15,0,(long)(int)(uVar8 - iVar15) << 4);
              vLevels->nCap = uVar8;
            }
            vLevels->nSize = uVar10;
          }
          pVVar3 = vLevels->pArray;
          Vec_IntPush(pVVar3 + uVar5 * 2,0);
          uVar12 = uVar4 & 0xffffffff;
        }
        else if (uVar5 < uVar13) {
          iVar2 = Gia_ManHashAnd(pNew,pNum[uVar5],pNum[uVar13]);
          iVar17 = iVar14 + (int)uVar13 + 1;
          if ((int)uVar12 <= iVar17) {
            uVar8 = (int)uVar12 * 2;
            uVar4 = uVar5 + uVar13 + 2;
            uVar12 = (ulong)uVar8;
            if ((int)uVar8 <= (int)uVar4) {
              uVar12 = uVar4 & 0xffffffff;
            }
            iVar11 = (int)uVar12;
            if (iVar11 - iVar15 != 0 && iVar15 <= iVar11) {
              if (local_90 == (Vec_Int_t *)0x0) {
                local_90 = (Vec_Int_t *)malloc(uVar12 << 4);
              }
              else {
                local_90 = (Vec_Int_t *)realloc(local_90,uVar12 << 4);
              }
              vProds->pArray = local_90;
              memset(local_90 + iVar15,0,(long)(iVar11 - iVar15) << 4);
              vProds->nCap = iVar11;
              uVar16 = uVar12;
            }
            vProds->nSize = (int)uVar4;
            uVar12 = uVar4 & 0xffffffff;
          }
          if ((int)uVar12 <= iVar17) goto LAB_008b1cef;
          Vec_IntPush((Vec_Int_t *)((long)&local_90->nCap + lVar7),iVar2);
          if (vLevels->nSize <= iVar17) {
            uVar8 = vLevels->nSize * 2;
            uVar18 = iVar14 + (int)uVar13 + 2;
            if ((int)uVar8 <= (int)uVar18) {
              uVar8 = uVar18;
            }
            iVar15 = vLevels->nCap;
            if (iVar15 < (int)uVar8) {
              if (vLevels->pArray == (Vec_Int_t *)0x0) {
                pVVar3 = (Vec_Int_t *)malloc((ulong)uVar8 << 4);
              }
              else {
                pVVar3 = (Vec_Int_t *)realloc(vLevels->pArray,(ulong)uVar8 << 4);
              }
              vLevels->pArray = pVVar3;
              memset(pVVar3 + iVar15,0,(long)(int)(uVar8 - iVar15) << 4);
              vLevels->nCap = uVar8;
            }
            vLevels->nSize = uVar18;
          }
          pVVar3 = vLevels->pArray;
          Vec_IntPush((Vec_Int_t *)((long)&pVVar3->nCap + lVar7),0);
        }
        uVar13 = uVar13 + 1;
        lVar7 = lVar7 + 0x10;
      } while ((uint)nNum != uVar13);
      uVar5 = uVar5 + 1;
      lVar6 = lVar6 + 0x10;
    } while (uVar5 != (uint)nNum);
  }
  Wlc_BlastReduceMatrix(pNew,vProds,vLevels,vRes,0,0);
  if ((int)uVar16 < 1) {
    if (local_90 != (Vec_Int_t *)0x0) goto LAB_008b1c78;
  }
  else {
    lVar6 = 0;
    do {
      pvVar1 = *(void **)((long)&local_90->pArray + lVar6);
      if (pvVar1 != (void *)0x0) {
        free(pvVar1);
        *(undefined8 *)((long)&local_90->pArray + lVar6) = 0;
      }
      lVar6 = lVar6 + 0x10;
    } while (uVar16 << 4 != lVar6);
LAB_008b1c78:
    free(local_90);
    pVVar3 = vLevels->pArray;
  }
  free(vProds);
  iVar14 = vLevels->nCap;
  if ((long)iVar14 < 1) {
    if (pVVar3 == (Vec_Int_t *)0x0) goto LAB_008b1cdc;
  }
  else {
    lVar6 = 0;
    do {
      pvVar1 = *(void **)((long)&pVVar3->pArray + lVar6);
      if (pvVar1 != (void *)0x0) {
        free(pvVar1);
        *(undefined8 *)((long)&pVVar3->pArray + lVar6) = 0;
      }
      lVar6 = lVar6 + 0x10;
    } while ((long)iVar14 * 0x10 != lVar6);
  }
  free(pVVar3);
LAB_008b1cdc:
  free(vLevels);
  return;
}

Assistant:

void Wlc_BlastSquare( Gia_Man_t * pNew, int * pNum, int nNum, Vec_Int_t * vTmp, Vec_Int_t * vRes )
{
    Vec_Wec_t * vProds  = Vec_WecStart( 2*nNum );
    Vec_Wec_t * vLevels = Vec_WecStart( 2*nNum );
    int i, k;
    for ( i = 0; i < nNum; i++ )
        for ( k = 0; k < nNum; k++ )
        {
            if ( i == k )
            {
                Vec_WecPush( vProds,  i+k, pNum[i] );
                Vec_WecPush( vLevels, i+k, 0 );
            }
            else if ( i < k )
            {
                Vec_WecPush( vProds,  i+k+1, Gia_ManHashAnd(pNew, pNum[i], pNum[k]) );
                Vec_WecPush( vLevels, i+k+1, 0 );
            }
        }

    Wlc_BlastReduceMatrix( pNew, vProds, vLevels, vRes, 0, 0 );

    Vec_WecFree( vProds );
    Vec_WecFree( vLevels );
}